

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool __thiscall USDFParser::ParseChoice(USDFParser *this,FStrifeDialogueReply ***replyptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FStrifeDialogueReply *this_00;
  size_t sVar5;
  PClassActor *pPVar6;
  FStrifeDialogueItemCheck *pFVar7;
  char *pcVar8;
  FName local_64;
  char *local_60;
  char *s;
  FName key;
  bool block;
  bool closeDialog;
  FString LogString;
  FString QuickNo;
  FString QuickYes;
  FString ReplyString;
  FStrifeDialogueReply *reply;
  FStrifeDialogueReply ***replyptr_local;
  USDFParser *this_local;
  
  this_00 = (FStrifeDialogueReply *)operator_new(0x88);
  FStrifeDialogueReply::FStrifeDialogueReply(this_00);
  this_00->LogString = (char *)0x0;
  this_00->QuickNo = (char *)0x0;
  this_00->QuickYes = (char *)0x0;
  this_00->NextNode = 0;
  this_00->LogNumber = 0;
  (this_00->ItemCheckExclude).Most = 0;
  (this_00->ItemCheckExclude).Count = 0;
  this_00->Reply = (char *)0x0;
  (this_00->ItemCheckRequire).Most = 0;
  (this_00->ItemCheckRequire).Count = 0;
  (this_00->ItemCheckExclude).Array = (FStrifeDialogueItemCheck *)0x0;
  (this_00->ItemCheck).Most = 0;
  (this_00->ItemCheck).Count = 0;
  (this_00->ItemCheckRequire).Array = (FStrifeDialogueItemCheck *)0x0;
  this_00->Args[3] = 0;
  this_00->Args[4] = 0;
  (this_00->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
  this_00->ActionSpecial = 0;
  this_00->Args[0] = 0;
  this_00->Args[1] = 0;
  this_00->Args[2] = 0;
  this_00->Next = (FStrifeDialogueReply *)0x0;
  this_00->GiveType = (PClassActor *)0x0;
  *(undefined8 *)&this_00->NeedsGold = 0;
  this_00->Next = **replyptr;
  **replyptr = this_00;
  *replyptr = (FStrifeDialogueReply **)this_00;
  FString::FString(&QuickYes);
  FString::FString(&QuickNo);
  FString::FString(&LogString);
  FString::FString((FString *)&key);
  s._7_1_ = 0;
  this_00->NeedsGold = false;
  while (bVar1 = FScanner::CheckToken((FScanner *)this,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    s._6_1_ = 0;
    UDMFParserBase::ParseKey((UDMFParserBase *)&s,SUB81(this,0),(bool *)0x1);
    if ((s._6_1_ & 1) == 0) {
      iVar2 = FName::operator_cast_to_int((FName *)&s);
      if (iVar2 == 0xed) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar8);
        this_00->ActionSpecial = iVar2;
        if ((this_00->ActionSpecial < 0) || (0xff < this_00->ActionSpecial)) {
          this_00->ActionSpecial = 0;
        }
      }
      else if (iVar2 - 0x118U < 5) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar8);
        iVar3 = FName::operator_cast_to_int((FName *)&s);
        this_00->Args[iVar3 + -0x118] = iVar2;
      }
      else if (iVar2 == 0x1df) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        pcVar8 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar8);
        FString::operator=(&QuickYes,pcVar8);
      }
      else if (iVar2 == 0x1e0) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        bVar1 = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar8);
        this_00->NeedsGold = bVar1;
      }
      else if (iVar2 == 0x1e1) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        pcVar8 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar8);
        FString::operator=(&QuickNo,pcVar8);
      }
      else if (iVar2 == 0x1e2) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        pcVar8 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar8);
        FString::operator=(&LogString,pcVar8);
      }
      else if (iVar2 == 0x1e3) {
        if ((this->super_UDMFParserBase).namespace_bits == 2) {
          pcVar8 = FName::operator_cast_to_char_((FName *)&s);
          local_60 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar8);
          sVar5 = strlen(local_60);
          if ((sVar5 < 4) || (iVar2 = strncasecmp(local_60,"LOG",3), iVar2 != 0)) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Log must be in the format of LOG# to compile, ignoring.");
          }
          else {
            iVar2 = atoi(local_60 + 3);
            this_00->LogNumber = iVar2;
          }
        }
        else {
          pcVar8 = FName::operator_cast_to_char_((FName *)&s);
          pcVar8 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar8);
          FString::operator=((FString *)&key,pcVar8);
        }
      }
      else if (iVar2 == 0x1e4) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        pPVar6 = CheckActorType(this,pcVar8);
        this_00->GiveType = pPVar6;
      }
      else if (iVar2 == 0x1e5) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar8);
        this_00->NextNode = iVar2;
      }
      else if (iVar2 == 0x1e6) {
        pcVar8 = FName::operator_cast_to_char_((FName *)&s);
        s._7_1_ = UDMFParserBase::CheckBool(&this->super_UDMFParserBase,pcVar8);
      }
    }
    else {
      iVar2 = FName::operator_cast_to_int((FName *)&s);
      if (((iVar2 == 0x1e7) || (iVar2 == 0x1f1 || iVar2 == 0x1f2)) &&
         ((bVar1 = FName::operator==((FName *)&s,NAME_Cost), bVar1 ||
          ((this->super_UDMFParserBase).namespace_bits == 1)))) {
        FName::FName(&local_64,(FName *)&s);
        ParseCostRequireExclude(this,this_00,&local_64);
      }
      else {
        FScanner::UnGet((FScanner *)this);
        UDMFParserBase::Skip(&this->super_UDMFParserBase);
      }
    }
  }
  uVar4 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Size(&this_00->ItemCheck);
  if ((uVar4 != 0) &&
     (pFVar7 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                         (&this_00->ItemCheck,0), pFVar7->Amount < 1)) {
    this_00->NeedsGold = false;
  }
  pcVar8 = FString::operator_cast_to_char_(&QuickYes);
  pcVar8 = ncopystring(pcVar8);
  this_00->Reply = pcVar8;
  pcVar8 = FString::operator_cast_to_char_(&QuickNo);
  pcVar8 = ncopystring(pcVar8);
  this_00->QuickYes = pcVar8;
  uVar4 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Size(&this_00->ItemCheck);
  if ((uVar4 == 0) ||
     (pFVar7 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                         (&this_00->ItemCheck,0), pFVar7->Item == (PClassInventory *)0x0)) {
    this_00->QuickNo = (char *)0x0;
  }
  else {
    pcVar8 = FString::operator_cast_to_char_(&LogString);
    pcVar8 = ncopystring(pcVar8);
    this_00->QuickNo = pcVar8;
  }
  pcVar8 = FString::operator_cast_to_char_((FString *)&key);
  pcVar8 = ncopystring(pcVar8);
  this_00->LogString = pcVar8;
  if ((s._7_1_ & 1) == 0) {
    this_00->NextNode = -this_00->NextNode;
  }
  FString::~FString((FString *)&key);
  FString::~FString(&LogString);
  FString::~FString(&QuickNo);
  FString::~FString(&QuickYes);
  return true;
}

Assistant:

bool ParseChoice(FStrifeDialogueReply **&replyptr)
	{
		FStrifeDialogueReply *reply = new FStrifeDialogueReply;
		memset(reply, 0, sizeof(*reply));

		reply->Next = *replyptr;
		*replyptr = reply;
		replyptr = &reply->Next;

		FString ReplyString;
		FString QuickYes;
		FString QuickNo;
		FString LogString;
		bool closeDialog = false;


		reply->NeedsGold = false;
		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Text:
					ReplyString = CheckString(key);
					break;

				case NAME_Displaycost:
					reply->NeedsGold = CheckBool(key);
					break;

				case NAME_Yesmessage:
					QuickYes = CheckString(key);
					//if (!QuickYes.Compare("_")) QuickYes = "";
					break;

				case NAME_Nomessage:
					QuickNo = CheckString(key);
					break;

				case NAME_Log:
					if (namespace_bits == St)
					{
						const char *s = CheckString(key);
						if(strlen(s) < 4 || strnicmp(s, "LOG", 3) != 0)
						{
							sc.ScriptMessage("Log must be in the format of LOG# to compile, ignoring.");
						}
						else
						{
							reply->LogNumber = atoi(s + 3);
						}
					}
					else
					{
						LogString = CheckString(key);
					}
					break;

				case NAME_Giveitem:
					reply->GiveType = CheckActorType(key);
					break;

				case NAME_Nextpage:
					reply->NextNode = CheckInt(key);
					break;

				case NAME_Closedialog:
					closeDialog = CheckBool(key);
					break;

				case NAME_Special:
					reply->ActionSpecial = CheckInt(key);
					if (reply->ActionSpecial < 0 || reply->ActionSpecial > 255)
						reply->ActionSpecial = 0;
					break;

				case NAME_Arg0:
				case NAME_Arg1:
				case NAME_Arg2:
				case NAME_Arg3:
				case NAME_Arg4:
					reply->Args[int(key)-int(NAME_Arg0)] = CheckInt(key);
					break;


				}
			}
			else
			{
				switch(key)
				{
				case NAME_Cost:
				case NAME_Require:
				case NAME_Exclude:
					// Require and Exclude are exclusive to namespace ZDoom. [FishyClockwork]
					if (key == NAME_Cost || namespace_bits == Zd)
					{
						ParseCostRequireExclude(reply, key);
						break;
					}
					// Intentional fall-through

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		// Todo: Finalize
		if (reply->ItemCheck.Size() > 0)
		{
			if (reply->ItemCheck[0].Amount <= 0) reply->NeedsGold = false;
		}

		reply->Reply = ncopystring(ReplyString);
		reply->QuickYes = ncopystring(QuickYes);
		if (reply->ItemCheck.Size() > 0 && reply->ItemCheck[0].Item != NULL)
		{
			reply->QuickNo = ncopystring(QuickNo);
		}
		else
		{
			reply->QuickNo = NULL;
		}
		reply->LogString = ncopystring(LogString);
		if(!closeDialog) reply->NextNode *= -1;
		return true;
	}